

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O3

pair<embree::Ref<embree::SceneGraph::MaterialNode>,_embree::vector_t<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_embree::aligned_allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_16UL>_>_>
* __thiscall
embree::CoronaLoader::loadInstances
          (pair<embree::Ref<embree::SceneGraph::MaterialNode>,_embree::vector_t<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_embree::aligned_allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_16UL>_>_>
           *__return_storage_ptr__,CoronaLoader *this,Ref<embree::XML> *xml)

{
  atomic<unsigned_long> *paVar1;
  string *__rhs;
  ulong uVar2;
  float *pfVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  undefined4 *puVar6;
  XML *pXVar7;
  undefined8 uVar8;
  pair<embree::Ref<embree::SceneGraph::MaterialNode>,_embree::vector_t<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_embree::aligned_allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_16UL>_>_>
  *ppVar9;
  int iVar10;
  Node *this_00;
  pointer pRVar11;
  runtime_error *prVar12;
  long *plVar13;
  long lVar14;
  size_type *psVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  ulong uVar17;
  ulong uVar18;
  char *this_01;
  undefined8 ptr;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  Ref<embree::SceneGraph::MaterialNode> material;
  Ref<embree::XML> child;
  Ref<embree::SceneGraph::MaterialNode> local_160;
  Ref<embree::XML> *local_158;
  string local_150;
  Ref<embree::XML> local_130;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  pair<embree::Ref<embree::SceneGraph::MaterialNode>,_embree::vector_t<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_embree::aligned_allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_16UL>_>_>
  *local_e8;
  CoronaLoader *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  string local_70;
  string local_50;
  
  local_158 = xml;
  local_e0 = this;
  iVar10 = std::__cxx11::string::compare((char *)&xml->ptr->name);
  if (iVar10 != 0) {
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    ParseLocation::str_abi_cxx11_(&local_150,&local_158->ptr->loc);
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_150);
    local_128._0_8_ = *plVar13;
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._0_8_ == paVar16) {
      local_118._M_allocated_capacity = paVar16->_M_allocated_capacity;
      local_118._8_8_ = plVar13[3];
      local_128._0_8_ = &local_118;
    }
    else {
      local_118._M_allocated_capacity = paVar16->_M_allocated_capacity;
    }
    local_128._8_8_ = plVar13[1];
    *plVar13 = (long)paVar16;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::runtime_error::runtime_error(prVar12,(string *)&local_128.field_1);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = (Node *)alignedUSMMalloc(0x180,0x10,DEVICE_READ_ONLY);
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  SceneGraph::Node::Node(this_00,&local_50);
  (this_00->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__OBJMaterial_002c6ae8;
  *(undefined4 *)&this_00[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined4 *)&this_00[1].fileName._M_string_length = 0;
  *(undefined8 *)((long)&this_00[1].fileName._M_string_length + 4) = 0x3f8000003f800000;
  *(undefined4 *)((long)&this_00[1].fileName.field_2 + 4) = 0x3f800000;
  *(undefined8 *)((long)&this_00[1].fileName.field_2 + 8) = 0;
  this_00[1].name._M_dataplus._M_p = (pointer)0x0;
  this_00[1].name._M_string_length = 0x3f8000003f800000;
  this_00[1].name.field_2._M_allocated_capacity = 0x3f8000003f800000;
  *(undefined8 *)((long)&this_00[1].name.field_2 + 8) = 0;
  this_00[1].indegree = 0;
  this_00[1].closed = false;
  this_00[1].hasLightOrCamera = false;
  *(undefined2 *)&this_00[1].field_0x5a = 0x3f80;
  this_00[1].id = 0x3f800000;
  this_00[1].geometry = (void *)0x3f8000003f800000;
  local_e8 = __return_storage_ptr__;
  memset(this_00 + 2,0,0xa8);
  LOCK();
  paVar1 = &(this_00->super_RefCount).refCounter;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_160.ptr = (MaterialNode *)this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_150._M_string_length = 0;
  local_150.field_2._M_allocated_capacity = 0;
  local_150.field_2._8_8_ = (void *)0x0;
  pRVar11 = (local_158->ptr->children).
            super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((local_158->ptr->children).
      super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != pRVar11) {
    ptr = (void *)0x0;
    uVar17 = 0;
    uVar19 = 0;
    uVar18 = 0;
    do {
      pXVar7 = pRVar11[uVar18].ptr;
      local_130.ptr = pXVar7;
      if (pXVar7 != (XML *)0x0) {
        (*(pXVar7->super_RefCount)._vptr_RefCount[2])(pXVar7);
      }
      __rhs = &pXVar7->name;
      iVar10 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar10 == 0) {
        loadMaterial((CoronaLoader *)&local_128.field_1,(Ref<embree::XML> *)local_e0);
        if (&(local_160.ptr)->super_Node != (Node *)0x0) {
          (*((local_160.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
        }
        local_160.ptr = (MaterialNode *)local_128._0_8_;
      }
      else {
        this_01 = "transform";
        iVar10 = std::__cxx11::string::compare((char *)__rhs);
        if (iVar10 != 0) {
          prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
          ParseLocation::str_abi_cxx11_(&local_70,&pXVar7->loc);
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_70);
          local_d8._M_dataplus._M_p = (pointer)*plVar13;
          psVar15 = (size_type *)(plVar13 + 2);
          if ((size_type *)local_d8._M_dataplus._M_p == psVar15) {
            local_d8.field_2._M_allocated_capacity = *psVar15;
            local_d8.field_2._8_8_ = plVar13[3];
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          }
          else {
            local_d8.field_2._M_allocated_capacity = *psVar15;
          }
          local_d8._M_string_length = plVar13[1];
          *plVar13 = (long)psVar15;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_128.field_1,&local_d8,__rhs);
          std::runtime_error::runtime_error(prVar12,(string *)&local_128.field_1);
          __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
                  ((AffineSpace3fa *)&local_128.field_1,(CoronaLoader *)this_01,&local_130);
        uVar2 = uVar19 + 1;
        uVar22 = local_128.m128[0];
        uVar23 = local_128.m128[1];
        uVar24 = local_128.m128[2];
        uVar25 = local_128.m128[3];
        uVar26 = local_118._M_allocated_capacity._0_4_;
        uVar27 = local_118._M_allocated_capacity._4_4_;
        uVar28 = local_118._8_4_;
        uVar29 = local_118._12_4_;
        uVar30 = local_108;
        uVar31 = uStack_104;
        uVar32 = uStack_100;
        uVar33 = uStack_fc;
        uVar34 = local_f8;
        uVar35 = uStack_f4;
        uVar36 = uStack_f0;
        uVar37 = uStack_ec;
        if (uVar17 < uVar2) {
          uVar21 = uVar2;
          uVar20 = uVar17;
          if (uVar17 != 0) {
            do {
              uVar21 = uVar20 * 2 + (ulong)(uVar20 * 2 == 0);
              uVar20 = uVar21;
            } while (uVar21 < uVar2);
          }
          if (uVar17 != uVar21) {
            local_b8 = local_f8;
            uStack_b4 = uStack_f4;
            uStack_b0 = uStack_f0;
            uStack_ac = uStack_ec;
            local_a8 = local_108;
            uStack_a4 = uStack_104;
            uStack_a0 = uStack_100;
            uStack_9c = uStack_fc;
            local_98 = local_118._M_allocated_capacity._0_4_;
            uStack_94 = local_118._M_allocated_capacity._4_4_;
            uStack_90 = local_118._8_4_;
            uStack_8c = local_118._12_4_;
            local_88 = local_128.m128[0];
            fStack_84 = local_128.m128[1];
            fStack_80 = local_128.m128[2];
            fStack_7c = local_128.m128[3];
            local_150.field_2._8_8_ = alignedMalloc(uVar21 << 6,0x10);
            if (uVar19 != 0) {
              lVar14 = 0x30;
              uVar17 = uVar19;
              do {
                puVar4 = (undefined8 *)(ptr + lVar14 + -0x30);
                uVar8 = puVar4[1];
                puVar5 = (undefined8 *)(local_150.field_2._8_8_ + lVar14 + -0x30);
                *puVar5 = *puVar4;
                puVar5[1] = uVar8;
                puVar4 = (undefined8 *)(ptr + lVar14 + -0x20);
                uVar8 = puVar4[1];
                puVar5 = (undefined8 *)(local_150.field_2._8_8_ + lVar14 + -0x20);
                *puVar5 = *puVar4;
                puVar5[1] = uVar8;
                puVar4 = (undefined8 *)(ptr + lVar14 + -0x10);
                uVar8 = puVar4[1];
                puVar5 = (undefined8 *)(local_150.field_2._8_8_ + lVar14 + -0x10);
                *puVar5 = *puVar4;
                puVar5[1] = uVar8;
                uVar8 = ((undefined8 *)(ptr + lVar14))[1];
                *(undefined8 *)(local_150.field_2._8_8_ + lVar14) = *(undefined8 *)(ptr + lVar14);
                ((undefined8 *)(local_150.field_2._8_8_ + lVar14))[1] = uVar8;
                lVar14 = lVar14 + 0x40;
                uVar17 = uVar17 - 1;
              } while (uVar17 != 0);
            }
            alignedFree((void *)ptr);
            uVar17 = uVar21;
            ptr = local_150.field_2._8_8_;
            uVar22 = local_88;
            uVar23 = fStack_84;
            uVar24 = fStack_80;
            uVar25 = fStack_7c;
            uVar26 = local_98;
            uVar27 = uStack_94;
            uVar28 = uStack_90;
            uVar29 = uStack_8c;
            uVar30 = local_a8;
            uVar31 = uStack_a4;
            uVar32 = uStack_a0;
            uVar33 = uStack_9c;
            uVar34 = local_b8;
            uVar35 = uStack_b4;
            uVar36 = uStack_b0;
            uVar37 = uStack_ac;
            local_150.field_2._M_allocated_capacity = uVar21;
          }
        }
        lVar14 = uVar19 * 0x40;
        pfVar3 = (float *)(ptr + lVar14);
        *pfVar3 = (float)uVar22;
        pfVar3[1] = (float)uVar23;
        pfVar3[2] = (float)uVar24;
        pfVar3[3] = (float)uVar25;
        puVar6 = (undefined4 *)(ptr + lVar14 + 0x10);
        *puVar6 = uVar26;
        puVar6[1] = uVar27;
        puVar6[2] = uVar28;
        puVar6[3] = uVar29;
        puVar6 = (undefined4 *)(ptr + lVar14 + 0x20);
        *puVar6 = uVar30;
        puVar6[1] = uVar31;
        puVar6[2] = uVar32;
        puVar6[3] = uVar33;
        puVar6 = (undefined4 *)(ptr + lVar14 + 0x30);
        *puVar6 = uVar34;
        puVar6[1] = uVar35;
        puVar6[2] = uVar36;
        puVar6[3] = uVar37;
        uVar19 = uVar2;
        local_150._M_string_length = uVar2;
      }
      if (pXVar7 != (XML *)0x0) {
        (*(pXVar7->super_RefCount)._vptr_RefCount[3])(pXVar7);
      }
      uVar18 = uVar18 + 1;
      pRVar11 = (local_158->ptr->children).
                super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar18 < (ulong)((long)(local_158->ptr->children).
                                    super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar11 >> 3)
            );
  }
  ppVar9 = local_e8;
  std::
  pair<embree::Ref<embree::SceneGraph::MaterialNode>,_embree::vector_t<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_embree::aligned_allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_16UL>_>_>
  ::
  pair<embree::Ref<embree::SceneGraph::MaterialNode>_&,_embree::vector_t<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_embree::aligned_allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_16UL>_>_&,_true>
            (local_e8,&local_160,
             (vector_t<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_embree::aligned_allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_16UL>_>
              *)&local_150);
  alignedFree((void *)local_150.field_2._8_8_);
  if (&(local_160.ptr)->super_Node != (Node *)0x0) {
    (*((local_160.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  return ppVar9;
}

Assistant:

std::pair<Ref<SceneGraph::MaterialNode>, avector<AffineSpace3fa> > CoronaLoader::loadInstances(const Ref<XML>& xml) 
  {
    if (xml->name != "instance") 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid instance node");

    /* create default material */
    Ref<SceneGraph::MaterialNode> material = new OBJMaterial;

    avector<AffineSpace3fa> xfms;
    for (size_t i=0; i<xml->children.size(); i++)
    {
      Ref<XML> child = xml->children[i];
      if      (child->name == "material" ) material = loadMaterial(child);
      else if (child->name == "transform") xfms.push_back(load<AffineSpace3fa>(child));
      else THROW_RUNTIME_ERROR(child->loc.str()+": unknown node: "+child->name);
    }

    return std::make_pair(material,xfms);
  }